

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Job.h
# Opt level: O0

void __thiscall xmrig::Job::Job(Job *this,Job *other)

{
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *in_RSI;
  Job *in_RDI;
  uint8_t *local_28;
  
  Buffer::Buffer(&in_RDI->m_seed);
  in_RDI->m_size = 0;
  String::String(&in_RDI->m_clientId);
  String::String(&in_RDI->m_extraNonce);
  String::String(&in_RDI->m_id);
  String::String(&in_RDI->m_poolWallet);
  in_RDI->m_backend = 0;
  in_RDI->m_diff = 0;
  in_RDI->m_height = 0;
  in_RDI->m_target = 0;
  in_RDI->m_blob[0] = '\0';
  local_28 = in_RDI->m_blob + 1;
  do {
    *local_28 = '\0';
    local_28 = local_28 + 1;
  } while (local_28 != &in_RDI->m_index);
  in_RDI->m_index = '\0';
  in_RDI->m_extraIters = 0;
  copy(in_RDI,in_RSI,src);
  return;
}

Assistant:

inline Job(const Job &other)        { copy(other); }